

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O0

bool __thiscall mocker::SSADestruction::operator()(SSADestruction *this)

{
  SSADestruction *this_local;
  
  insertAllocas(this);
  splitCriticalEdges(this);
  replacePhisWithParallelCopies(this);
  sequentializeParallelCopies(this);
  return false;
}

Assistant:

bool SSADestruction::operator()() {
  insertAllocas();
  splitCriticalEdges();
  //  ir::printFunc(func, std::cerr);
  replacePhisWithParallelCopies();
  sequentializeParallelCopies();
  return false;
}